

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O0

_Bool isInfinity(char **endptr)

{
  int iVar1;
  _Bool local_11;
  _Bool result;
  char **endptr_local;
  
  local_11 = false;
  iVar1 = substricmp(*endptr,"INF");
  if (iVar1 == 0) {
    *endptr = *endptr + 3;
    local_11 = true;
    iVar1 = substricmp(*endptr,"INITY");
    if (iVar1 == 0) {
      *endptr = *endptr + 5;
    }
  }
  return local_11;
}

Assistant:

static bool isInfinity(const char** endptr)
{
    bool result = false;
    if (substricmp((*endptr), "INF") == 0)
    {
        (*endptr) += 3;
        result = true;
        if (substricmp((*endptr), "INITY") == 0)
        {
            (*endptr) += 5;
        }
    }
    return result;
}